

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

QColor QtMWidgets::darkerColor(QColor *c,int b)

{
  int iVar1;
  undefined8 uVar2;
  ulong uVar3;
  Spec SVar4;
  undefined1 auVar5 [16];
  QColor QVar6;
  int h;
  int a;
  int s;
  int local_50 [4];
  undefined8 local_40;
  undefined4 local_38;
  undefined2 local_34;
  
  if (b < 1) {
    uVar2 = *(undefined8 *)c;
    uVar3 = *(ulong *)((long)&c->ct + 4);
  }
  else {
    local_50[0] = 0;
    local_50[3] = 0;
    local_50[2] = 0;
    local_50[1] = 0;
    auVar5 = QColor::toHsv();
    local_40 = auVar5._0_8_;
    local_38 = auVar5._8_4_;
    local_34 = auVar5._12_2_;
    QColor::getHsv((int *)&local_40,local_50,local_50 + 3,local_50 + 2);
    iVar1 = local_50[2] - b;
    local_50[2] = 0;
    if (0 < iVar1) {
      local_50[2] = iVar1;
    }
    SVar4 = (Spec)&local_40;
    QColor::setHsv(SVar4,local_50[0],local_50[3],local_50[2]);
    auVar5 = QColor::convertTo(SVar4);
    uVar2 = auVar5._0_8_;
    uVar3 = auVar5._8_8_ & 0xffffffffffff;
  }
  QVar6._8_8_ = uVar3;
  QVar6._0_8_ = uVar2;
  return QVar6;
}

Assistant:

QColor
darkerColor( const QColor & c, int b )
{
	if( b <= 0 )
		return c;

	int h = 0;
	int s = 0;
	int v = 0;
	int a = 0;

	QColor hsv = c.toHsv();
	hsv.getHsv( &h, &s, &v, &a );

	v -= b;

	if( v < 0 )
		v = 0;

	hsv.setHsv( h, s, v, a );

	return hsv.convertTo( c.spec() );
}